

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O2

size_type __thiscall llvm::StringRef::find_first_not_of(StringRef *this,char C,size_t From)

{
  ulong uVar1;
  size_type sVar2;
  
  uVar1 = this->Length;
  if (uVar1 < From) {
    From = uVar1;
  }
  for (; (sVar2 = 0xffffffffffffffff, uVar1 != From && (sVar2 = From, this->Data[From] == C));
      From = From + 1) {
  }
  return sVar2;
}

Assistant:

StringRef::size_type StringRef::find_first_not_of(char C, size_t From) const {
  for (size_type i = std::min(From, Length), e = Length; i != e; ++i)
    if (Data[i] != C)
      return i;
  return npos;
}